

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

ArrayNewFixed * __thiscall
wasm::Builder::makeArrayNewFixed
          (Builder *this,HeapType type,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *values)

{
  Type local_30;
  ArrayNewFixed *local_28;
  ArrayNewFixed *ret;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *values_local;
  Builder *this_local;
  HeapType type_local;
  
  ret = (ArrayNewFixed *)values;
  values_local = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)this;
  this_local = (Builder *)type.id;
  local_28 = MixedArena::alloc<wasm::ArrayNewFixed>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&local_28->values,
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)ret);
  ::wasm::Type::Type(&local_30,(HeapType)this_local,NonNullable);
  (local_28->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id =
       local_30.id;
  ::wasm::ArrayNewFixed::finalize();
  return local_28;
}

Assistant:

ArrayNewFixed* makeArrayNewFixed(HeapType type,
                                   const std::vector<Expression*>& values) {
    auto* ret = wasm.allocator.alloc<ArrayNewFixed>();
    ret->values.set(values);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }